

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

ImageTemplate<unsigned_short> * __thiscall
PenguinV_Image::ImageTemplate<unsigned_short>::generate
          (ImageTemplate<unsigned_short> *this,uint32_t width_,uint32_t height_,uint8_t colorCount_,
          uint8_t alignment_)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  ImageTemplate<unsigned_short> *in_RSI;
  ImageTemplate<unsigned_short> *in_RDI;
  undefined4 in_R8D;
  ImageTemplate<unsigned_short> *image;
  uint8_t colorCount__00;
  undefined2 uVar1;
  uint8_t alignment__00;
  uint8_t colorCount__01;
  ImageTemplate<unsigned_short> *pIVar2;
  
  colorCount__00 = (uint8_t)((uint)in_R8D >> 0x18);
  uVar1 = (undefined2)in_EDX;
  alignment__00 = (uint8_t)((uint)in_EDX >> 0x10);
  colorCount__01 = (uint8_t)((uint)in_EDX >> 0x18);
  pIVar2 = in_RDI;
  ImageTemplate(in_RSI,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,colorCount__01,
                alignment__00);
  in_RDI->_type = in_RSI->_type;
  setColorCount((ImageTemplate<unsigned_short> *)
                CONCAT17(colorCount__01,CONCAT16(alignment__00,CONCAT24(uVar1,in_ECX))),
                colorCount__00);
  setAlignment((ImageTemplate<unsigned_short> *)
               CONCAT17(colorCount__01,CONCAT16(alignment__00,CONCAT24(uVar1,in_ECX))),
               colorCount__00);
  resize(in_RSI,(uint32_t)((ulong)pIVar2 >> 0x20),(uint32_t)pIVar2);
  return pIVar2;
}

Assistant:

ImageTemplate generate( uint32_t width_ = 0u, uint32_t height_ = 0u, uint8_t colorCount_ = 1u, uint8_t alignment_ = 1u ) const
        {
            ImageTemplate image;
            image._type = _type;

            image.setColorCount( colorCount_ );
            image.setAlignment( alignment_ );
            image.resize( width_, height_ );

            return image;
        }